

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

shared_ptr<const_helics::SmallBuffer> * __thiscall
helics::CommonCore::getValue(CommonCore *this,InterfaceHandle handle,uint32_t *inputIndex)

{
  pair<helics::route_id,_helics::ActionMessage> *ppVar1;
  FederateState *this_00;
  shared_ptr<const_helics::SmallBuffer> *psVar2;
  InvalidIdentifier *this_01;
  char *pcVar3;
  size_t sVar4;
  string_view message;
  
  ppVar1 = getHandleInfo(this,handle);
  if (ppVar1 == (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar3 = "Handle is invalid (getValue)";
    sVar4 = 0x1c;
  }
  else {
    if ((char)(ppVar1->second).messageID == 'i') {
      this_00 = getFederateAt(this,(LocalFederateId)(ppVar1->second).messageAction);
      FederateState::sleeplock(this_00);
      psVar2 = FederateState::getValue(this_00,handle,inputIndex);
      LOCK();
      (this_00->processing).super___atomic_flag_base._M_i = false;
      UNLOCK();
      return psVar2;
    }
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar3 = "Handle does not identify an input";
    sVar4 = 0x21;
  }
  message._M_str = pcVar3;
  message._M_len = sVar4;
  InvalidIdentifier::InvalidIdentifier(this_01,message);
  __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

const std::shared_ptr<const SmallBuffer>& CommonCore::getValue(InterfaceHandle handle,
                                                               uint32_t* inputIndex)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("Handle is invalid (getValue)"));
    }

    if (handleInfo->handleType != InterfaceType::INPUT) {
        throw(InvalidIdentifier("Handle does not identify an input"));
    }
    auto& fed = *getFederateAt(handleInfo->local_fed_id);
    const std::lock_guard<FederateState> lock(fed);
    return fed.getValue(handle, inputIndex);
}